

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O0

int SUNContext_SetLogger(SUNContext sunctx,SUNLogger logger)

{
  int iVar1;
  SUNLogger in_RSI;
  SUNLogger *in_RDI;
  int local_4;
  
  if (in_RDI == (SUNLogger *)0x0) {
    local_4 = -1;
  }
  else {
    if ((in_RDI[2] != (SUNLogger)0x0) && (*(int *)(in_RDI + 3) != 0)) {
      iVar1 = SUNLogger_Destroy(in_RDI);
      if (iVar1 != 0) {
        return -1;
      }
      in_RDI[2] = (SUNLogger)0x0;
    }
    in_RDI[2] = in_RSI;
    *(undefined4 *)(in_RDI + 3) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNContext_SetLogger(SUNContext sunctx, SUNLogger logger)
{
  if (sunctx == NULL)
  {
    return (-1);
  }

  /* free any existing logger */
  if (sunctx->logger && sunctx->own_logger)
  {
    if (SUNLogger_Destroy(&(sunctx->logger)))
    {
      return (-1);
    }
    sunctx->logger = NULL;
  }

  /* set logger */
  sunctx->logger     = logger;
  sunctx->own_logger = SUNFALSE;

  return (0);
}